

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  uVar3 = (this->dx_).num_elts;
  if (uVar2 != uVar3) {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar3 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar8 = (long)(int)uVar2 << 3;
      }
      pdVar6 = (double *)operator_new__(uVar8);
      (this->dx_).ptr_to_data = pdVar6;
    }
  }
  if (uVar2 != 0) {
    pdVar6 = (this->dx_).ptr_to_data;
    if ((((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts == 0) {
      if (0 < (int)uVar2) {
        lVar9 = 0;
        do {
          pFVar4 = (fadexpr->fadexpr_).right_;
          pFVar5 = (pFVar4->fadexpr_).expr_.fadexpr_.right_;
          pdVar7 = &pFVar5->defaultVal;
          if ((pFVar5->dx_).num_elts != 0) {
            pdVar7 = (double *)((long)(pFVar5->dx_).ptr_to_data + lVar9);
          }
          dVar1 = (pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_;
          dVar11 = *pdVar7;
          dVar10 = ::exp(dVar1 * pFVar5->val_);
          *(double *)((long)pdVar6 + lVar9) =
               dVar10 * dVar11 * dVar1 * (fadexpr->fadexpr_).left_.constant_;
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar2 * 8 - lVar9 != 0);
      }
    }
    else if (0 < (int)uVar2) {
      uVar8 = 0;
      do {
        pFVar4 = (fadexpr->fadexpr_).right_;
        pFVar5 = (pFVar4->fadexpr_).expr_.fadexpr_.right_;
        dVar1 = (pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_;
        dVar11 = (pFVar5->dx_).ptr_to_data[uVar8];
        dVar10 = ::exp(dVar1 * pFVar5->val_);
        pdVar6[uVar8] = dVar10 * dVar11 * dVar1 * (fadexpr->fadexpr_).left_.constant_;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  dVar11 = ::exp((pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_ *
                 ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar11 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}